

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

char * str_replace_many(char *_haystack,...)

{
  char *needle;
  char in_AL;
  char *haystack;
  void **ppvVar1;
  char *pcVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_e0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &ap[0].overflow_arg_area;
  uVar3 = 8;
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  haystack = strdup(_haystack);
  do {
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0x29) {
      uVar3 = uVar3 + 8;
      ppvVar1 = (void **)((long)local_c8 + uVar4);
    }
    else {
      ppvVar1 = local_e0;
      local_e0 = local_e0 + 1;
    }
    needle = (char *)*ppvVar1;
    pcVar2 = haystack;
    if (needle != (char *)0x0) {
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        ppvVar1 = (void **)((long)local_c8 + uVar4);
      }
      else {
        ppvVar1 = local_e0;
        local_e0 = local_e0 + 1;
      }
      pcVar2 = str_replace(haystack,needle,(char *)*ppvVar1);
      free(haystack);
    }
    haystack = pcVar2;
  } while (needle != (char *)0x0);
  return pcVar2;
}

Assistant:

char *str_replace_many(const char *_haystack, ...)
{
    va_list ap;
    va_start(ap, _haystack);

    char *haystack = strdup(_haystack);

    while (true) {
        char *needle = va_arg(ap, char*);
        if (!needle)
            break;

        char *replacement = va_arg(ap, char*);
        char *tmp = str_replace(haystack, needle, replacement);
        free(haystack);
        haystack = tmp;
    }

    va_end(ap);

    return haystack;
}